

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::Append
          (BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *this,
          UnifiedVectorFormat *vdata,idx_t count)

{
  ulong in_RDX;
  UnifiedVectorFormat *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  bool in_stack_00000027;
  idx_t idx;
  idx_t i;
  hugeint_t *data;
  idx_t local_28;
  
  UnifiedVectorFormat::GetData<duckdb::hugeint_t>(in_RSI);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    SelectionVector::get_index(in_RSI->sel,local_28);
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (in_RDI,(idx_t)&in_RDI[2].validity_data.internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>::
    Update<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
              ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)idx,_i,in_stack_00000027);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}